

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day06b.cpp
# Opt level: O2

string * day6b::recover_message(string *__return_storage_ptr__,string *input)

{
  char cVar1;
  pair<char,_char> pVar2;
  istream *piVar3;
  long lVar4;
  pair<char,_char> *ppVar5;
  long lVar6;
  size_type sVar7;
  pair<char,_char> *__last;
  array<std::pair<char,_char>,_26UL> *letters;
  pair<char,_char> *__first;
  allocator_type local_201;
  string line;
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  columns;
  istringstream stream;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&stream,(string *)input,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)&stream,(string *)&line);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)line._M_string_length);
  std::
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  ::vector(&columns,line._M_string_length,&local_201);
  do {
    ppVar5 = columns.
             super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[-4]._M_elems + 7;
    for (sVar7 = 0; line._M_string_length != sVar7; sVar7 = sVar7 + 1) {
      cVar1 = line._M_dataplus._M_p[sVar7];
      ppVar5[cVar1].first = cVar1;
      ppVar5[cVar1].second = ppVar5[cVar1].second + '\x01';
      ppVar5 = ppVar5 + 0x1a;
    }
    piVar3 = std::operator>>((istream *)&stream,(string *)&line);
  } while (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0);
  ppVar5 = (columns.
            super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_elems + 1;
  lVar4 = 0;
  __first = (columns.
             super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
  while (__first !=
         (columns.
          super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->_M_elems) {
    std::
    __introsort_loop<std::pair<char,char>*,long,__gnu_cxx::__ops::_Iter_comp_iter<day6b::recover_message(std::__cxx11::string_const&)::__0>>
              (__first,__first + 0x1a,8);
    __last = ppVar5;
    for (lVar6 = 0x1e; lVar6 != 0; lVar6 = lVar6 + -2) {
      if ((__last->second == '\0') ||
         ((__first->second != '\0' && (__first->second <= __last->second)))) {
        std::
        __unguarded_linear_insert<std::pair<char,char>*,__gnu_cxx::__ops::_Val_comp_iter<day6b::recover_message(std::__cxx11::string_const&)::__0>>
                  (__last);
      }
      else {
        pVar2 = *__last;
        std::__copy_move_backward<true,false,std::random_access_iterator_tag>::
        __copy_move_b<std::pair<char,char>*,std::pair<char,char>*>(__first,__last,__last + 1);
        *__first = pVar2;
      }
      __last = __last + 1;
    }
    for (lVar6 = 0x20; lVar6 != 0x34; lVar6 = lVar6 + 2) {
      std::
      __unguarded_linear_insert<std::pair<char,char>*,__gnu_cxx::__ops::_Val_comp_iter<day6b::recover_message(std::__cxx11::string_const&)::__0>>
                (&__first->first + lVar6);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p[lVar4] = __first->first;
    lVar4 = lVar4 + 1;
    ppVar5 = ppVar5 + 0x1a;
    __first = __first + 0x1a;
  }
  std::
  _Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  ::~_Vector_base(&columns.
                   super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                 );
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::istringstream::~istringstream((istringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

std::string recover_message(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		stream >> line;
		std::string ret(line.size(), ' ');
		std::vector<std::array<std::pair<char, char>, 26>> columns(line.size());
		do {
			int i = 0;
			for(auto c : line) {
				auto& l = columns[i++][c - 'a'];
				l.first = c;
				l.second++;
			}
		} while(stream >> line);

		int i = 0;
		for(auto& letters : columns) {
			std::sort(letters.begin(), letters.end(), [](const auto& a, const auto& b) {
				if(a.second == 0) return false;
				if(b.second == 0) return true;
				return a.second < b.second;
			});
			ret[i++] = letters[0].first;
		}
		return ret;
	}